

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluStrUtil.cpp
# Opt level: O0

ostream * glu::operator<<(ostream *str,ContextType contextType)

{
  ApiType apiType;
  ContextFlags CVar1;
  Hex<8UL> hex;
  int local_24;
  ContextFlags local_20;
  int ndx;
  ContextFlags flags;
  ostream *str_local;
  ContextType contextType_local;
  
  str_local._4_4_ = contextType.super_ApiType.m_bits;
  apiType = ContextType::getAPI((ContextType *)((long)&str_local + 4));
  operator<<(str,apiType);
  CVar1 = ContextType::getFlags((ContextType *)((long)&str_local + 4));
  if (CVar1 != 0) {
    local_20 = ContextType::getFlags((ContextType *)((long)&str_local + 4));
    std::operator<<(str," (");
    for (local_24 = 0; local_24 < 3 && local_20 != 0; local_24 = local_24 + 1) {
      CVar1 = operator&(local_20,operator<<::s_descs[local_24].flag);
      if (CVar1 != 0) {
        CVar1 = ContextType::getFlags((ContextType *)((long)&str_local + 4));
        if (local_20 != CVar1) {
          std::operator<<(str,", ");
        }
        std::operator<<(str,operator<<::s_descs[local_24].desc);
        CVar1 = operator~(operator<<::s_descs[local_24].flag);
        local_20 = operator&(local_20,CVar1);
      }
    }
    if (local_20 != 0) {
      CVar1 = ContextType::getFlags((ContextType *)((long)&str_local + 4));
      if (local_20 != CVar1) {
        std::operator<<(str,", ");
      }
      hex = tcu::toHex<glu::ContextFlags>(local_20);
      tcu::Format::operator<<(str,hex);
    }
    std::operator<<(str,")");
  }
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, ContextType contextType)
{
	str << contextType.getAPI();

	if (contextType.getFlags() != ContextFlags(0))
	{
		static const struct
		{
			ContextFlags	flag;
			const char*		desc;
		} s_descs[] =
		{
			{ CONTEXT_DEBUG,				"debug"					},
			{ CONTEXT_FORWARD_COMPATIBLE,	"forward-compatible"	},
			{ CONTEXT_ROBUST,				"robust"				}
		};
		ContextFlags	flags	= contextType.getFlags();

		str << " (";

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_descs) && flags != 0; ndx++)
		{
			if ((flags & s_descs[ndx].flag) != 0)
			{
				if (flags != contextType.getFlags())
					str << ", ";

				str << s_descs[ndx].desc;
				flags = flags & ~s_descs[ndx].flag;
			}
		}

		if (flags != 0)
		{
			// Unresolved
			if (flags != contextType.getFlags())
				str << ", ";
			str << tcu::toHex(flags);
		}

		str << ")";
	}

	return str;
}